

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

Map * __thiscall flexbuffers::Reference::AsMap(Map *__return_storage_ptr__,Reference *this)

{
  uint8_t *data;
  
  if (this->type_ == FBT_MAP) {
    data = Indirect(this);
    Sized::Sized((Sized *)__return_storage_ptr__,data,this->byte_width_);
  }
  else {
    Map::EmptyMap();
  }
  return __return_storage_ptr__;
}

Assistant:

Map AsMap() const {
    if (type_ == FBT_MAP) {
      return Map(Indirect(), byte_width_);
    } else {
      return Map::EmptyMap();
    }
  }